

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
* __thiscall
gtl::
dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
::operator=(dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
            *this,dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
                  *ht)

{
  SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *pSVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  type_conflict1 tVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 uVar11;
  uint uVar12;
  
  if (ht != this) {
    if (this->table != (pointer)0x0) {
      operator_delete(this->table);
      this->table = (pointer)0x0;
    }
    tVar5 = (ht->key_info).empty;
    (this->key_info).delkey = (ht->key_info).delkey;
    (this->key_info).empty = tVar5;
    pSVar1 = (ht->key_info).super_IdKeyEqual.lexicon_;
    *(undefined8 *)&(this->key_info).super_IdKeyEqual =
         *(undefined8 *)&(ht->key_info).super_IdKeyEqual;
    (this->key_info).super_IdKeyEqual.lexicon_ = pSVar1;
    pSVar1 = (ht->settings).
             super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
             .super_IdHasher.lexicon_;
    sVar2 = (ht->settings).
            super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
            .enlarge_threshold_;
    sVar3 = (ht->settings).
            super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
            .shrink_threshold_;
    fVar6 = (ht->settings).
            super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
            .enlarge_factor_;
    fVar7 = (ht->settings).
            super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
            .shrink_factor_;
    bVar8 = (ht->settings).
            super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
            .consider_shrink_;
    bVar9 = (ht->settings).
            super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
            .use_empty_;
    bVar10 = (ht->settings).
             super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
             .use_deleted_;
    uVar11 = (ht->settings).
             super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
             .field_0x2b;
    uVar12 = (ht->settings).
             super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
             .num_ht_copies_;
    *(undefined8 *)
     &(this->settings).
      super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
      .super_IdHasher =
         *(undefined8 *)
          &(ht->settings).
           super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
           .super_IdHasher;
    (this->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .super_IdHasher.lexicon_ = pSVar1;
    (this->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .enlarge_threshold_ = sVar2;
    (this->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .shrink_threshold_ = sVar3;
    (this->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .enlarge_factor_ = fVar6;
    (this->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .shrink_factor_ = fVar7;
    (this->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .consider_shrink_ = bVar8;
    (this->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .use_empty_ = bVar9;
    (this->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .use_deleted_ = bVar10;
    (this->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .field_0x2b = uVar11;
    (this->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .num_ht_copies_ = uVar12;
    sVar4 = ht->num_elements;
    this->num_deleted = ht->num_deleted;
    this->num_elements = sVar4;
    ht->num_deleted = 0;
    ht->num_elements = 0;
    this->num_buckets = ht->num_buckets;
    ht->num_buckets = 0x20;
    (ht->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .use_empty_ = false;
    (ht->settings).
    super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    .use_deleted_ = false;
    this->table = ht->table;
    ht->table = (pointer)0x0;
  }
  return this;
}

Assistant:

dense_hashtable& operator=(dense_hashtable&& ht) {
    if (&ht == this) return *this;        // don't move onto ourselves

    const bool can_move_table =
        std::allocator_traits<
            Alloc>::propagate_on_container_move_assignment::value ||
        key_info.as_value_alloc() == ht.key_info.as_value_alloc();

    // First, deallocate with this's allocator.
    destroy_table();

    if (std::allocator_traits<
            value_alloc_type>::propagate_on_container_move_assignment::value) {
      // This moves the allocator.
      key_info = std::move(ht.key_info);
    } else {
      // Move all other base classes of key_info from ht, but don't move the
      // allocator.
      key_info.as_extract_key() = std::move(ht.key_info.as_extract_key());
      key_info.as_set_key() = std::move(ht.key_info.as_set_key());
      key_info.as_equal_key() = std::move(ht.key_info.as_equal_key());
      key_info.delkey = std::move(ht.key_info.delkey);
      key_info.empty = std::move(ht.key_info.empty);
    }

    settings = std::move(ht.settings);
    num_deleted = ht.num_deleted;
    ht.num_deleted = 0;
    num_elements = ht.num_elements;
    ht.num_elements = 0;
    num_buckets = ht.num_buckets;
    ht.num_buckets = HT_DEFAULT_STARTING_BUCKETS;
    ht.settings.set_use_empty(false);
    ht.settings.set_use_deleted(false);

    if (can_move_table) {
      // We can transfer ownership of the table from ht to this because either
      // we're propagating the allocator or ht's allocator is equal to this's.
      table = ht.table;
      ht.table = nullptr;
    } else if (ht.table) {
      // We can't transfer ownership of any memory from ht to this, so the
      // best we can do is move element-by-element.
      table = get_internal_allocator().allocate(num_buckets);
      for (size_type i = 0; i < num_buckets; ++i) {
        new(table + i) Value(std::move(ht.table[i]));
      }
      ht.destroy_table();
    }

    return *this;
  }